

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ConvolutionLayerParams::ConvolutionLayerParams
          (ConvolutionLayerParams *this,ConvolutionLayerParams *from)

{
  bool bVar1;
  ConvolutionPaddingTypeCase CVar2;
  InternalMetadataWithArenaLite *this_00;
  WeightParams *pWVar3;
  ValidPadding *this_01;
  ValidPadding *from_00;
  SamePadding *this_02;
  SamePadding *from_01;
  ConvolutionLayerParams *from_local;
  ConvolutionLayerParams *this_local;
  string *local_20;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__ConvolutionLayerParams_0056d530;
  google::protobuf::internal::InternalMetadataWithArenaLite::InternalMetadataWithArenaLite
            (&this->_internal_metadata_,(Arena *)0x0);
  google::protobuf::RepeatedField<unsigned_long>::RepeatedField
            (&this->kernelsize_,&from->kernelsize_);
  google::protobuf::RepeatedField<unsigned_long>::RepeatedField(&this->stride_,&from->stride_);
  google::protobuf::RepeatedField<unsigned_long>::RepeatedField
            (&this->dilationfactor_,&from->dilationfactor_);
  google::protobuf::RepeatedField<unsigned_long>::RepeatedField
            (&this->outputshape_,&from->outputshape_);
  ConvolutionPaddingTypeUnion::ConvolutionPaddingTypeUnion
            ((ConvolutionPaddingTypeUnion *)&this->ConvolutionPaddingType_);
  this->_cached_size_ = 0;
  this_00 = &from->_internal_metadata_;
  if (((uint)(this_00->
             super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
             ).ptr_ & 1) == 1) {
    if (((uint)(this_00->
               super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
               ).ptr_ & 1) == 1) {
      local_20 = (string *)
                 google::protobuf::internal::
                 InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>::Container>
                           ((InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                             *)this_00);
    }
    else {
      local_20 = google::protobuf::internal::InternalMetadataWithArenaLite::
                 default_instance_abi_cxx11_();
    }
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,local_20);
  }
  bVar1 = has_weights(from);
  if (bVar1) {
    pWVar3 = (WeightParams *)operator_new(0x50);
    WeightParams::WeightParams(pWVar3,from->weights_);
    this->weights_ = pWVar3;
  }
  else {
    this->weights_ = (WeightParams *)0x0;
  }
  bVar1 = has_bias(from);
  if (bVar1) {
    pWVar3 = (WeightParams *)operator_new(0x50);
    WeightParams::WeightParams(pWVar3,from->bias_);
    this->bias_ = pWVar3;
  }
  else {
    this->bias_ = (WeightParams *)0x0;
  }
  memcpy(&this->outputchannels_,&from->outputchannels_,
         (long)this + (0x9a - (long)&this->outputchannels_));
  clear_has_ConvolutionPaddingType(this);
  CVar2 = ConvolutionPaddingType_case(from);
  if (CVar2 != CONVOLUTIONPADDINGTYPE_NOT_SET) {
    if (CVar2 == kValid) {
      this_01 = mutable_valid(this);
      from_00 = valid(from);
      ValidPadding::MergeFrom(this_01,from_00);
    }
    else if (CVar2 == kSame) {
      this_02 = mutable_same(this);
      from_01 = same(from);
      SamePadding::MergeFrom(this_02,from_01);
    }
  }
  return;
}

Assistant:

ConvolutionLayerParams::ConvolutionLayerParams(const ConvolutionLayerParams& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      kernelsize_(from.kernelsize_),
      stride_(from.stride_),
      dilationfactor_(from.dilationfactor_),
      outputshape_(from.outputshape_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  if (from.has_weights()) {
    weights_ = new ::CoreML::Specification::WeightParams(*from.weights_);
  } else {
    weights_ = NULL;
  }
  if (from.has_bias()) {
    bias_ = new ::CoreML::Specification::WeightParams(*from.bias_);
  } else {
    bias_ = NULL;
  }
  ::memcpy(&outputchannels_, &from.outputchannels_,
    reinterpret_cast<char*>(&hasbias_) -
    reinterpret_cast<char*>(&outputchannels_) + sizeof(hasbias_));
  clear_has_ConvolutionPaddingType();
  switch (from.ConvolutionPaddingType_case()) {
    case kValid: {
      mutable_valid()->::CoreML::Specification::ValidPadding::MergeFrom(from.valid());
      break;
    }
    case kSame: {
      mutable_same()->::CoreML::Specification::SamePadding::MergeFrom(from.same());
      break;
    }
    case CONVOLUTIONPADDINGTYPE_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.ConvolutionLayerParams)
}